

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_io.c
# Opt level: O1

int unix_timeout_read_func(void *conn,void *buffer,size_t length,int *errno_p,char **result_p)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int __fd;
  int local_48;
  
  __fd = (int)conn;
  uVar2 = fcntl(__fd,3,0);
  uVar8 = uVar2 | 0x800;
  iVar3 = fcntl(__fd,4,(ulong)uVar8);
  if (iVar3 == -1) {
    perror("fcntl block");
  }
  sVar5 = read(__fd,buffer,length);
  iVar3 = (int)sVar5;
  if (iVar3 == -1) {
    piVar6 = __errno_location();
    iVar9 = *piVar6;
    if (errno_p != (int *)0x0) {
      *errno_p = iVar9;
    }
    if ((iVar9 == 4) || (iVar9 == 0xb)) {
      if (errno_p != (int *)0x0) {
        *errno_p = 0;
      }
      iVar3 = 0;
    }
    else {
      uVar8 = uVar2 & 0xfffff7ff;
      iVar4 = fcntl(__fd,4,(ulong)uVar8);
      iVar3 = -1;
      if (iVar4 == -1) {
        perror("fcntl nonblock");
      }
    }
    if ((iVar9 != 0xb) && (iVar9 != 4)) {
      return -1;
    }
  }
  else if (iVar3 == 0) {
    if (result_p != (char **)0x0) {
      *result_p = "End of file";
    }
    if (errno_p != (int *)0x0) {
      *errno_p = 0;
    }
    iVar3 = fcntl(__fd,4,(ulong)(uVar2 & 0xfffff7ff));
    if (iVar3 == -1) {
      perror("fcntl nonblock");
    }
    return 0;
  }
  iVar9 = (int)length;
  if (0 < iVar9 - iVar3) {
    local_48 = -1;
    bVar7 = false;
    uVar2 = iVar9 - iVar3;
    do {
      if (bVar7) {
        iVar3 = fcntl(__fd,4,(ulong)(uVar8 & 0xfffff7ff));
        if (iVar3 != -1) {
          return -1;
        }
        perror("fcntl nonblock");
        return -1;
      }
      sleep(1);
      sVar5 = read(__fd,(void *)((long)buffer + (length - uVar2)),(ulong)uVar2);
      iVar3 = (int)sVar5;
      if (iVar3 == -1) {
        piVar6 = __errno_location();
        iVar4 = *piVar6;
        if (errno_p != (int *)0x0) {
          *errno_p = iVar4;
        }
        if ((iVar4 == 4) || (iVar4 == 0xb)) {
          iVar3 = 0;
          if (errno_p != (int *)0x0) {
            *errno_p = 0;
          }
        }
        else {
          uVar8 = uVar8 & 0xfffff7ff;
          iVar3 = fcntl(__fd,4,(ulong)uVar8);
          if (iVar3 == -1) {
            perror("fcntl nonblock");
          }
          local_48 = iVar9 - uVar2;
          iVar3 = -1;
        }
        if ((iVar4 != 0xb) && (iVar4 != 4)) {
          return local_48;
        }
      }
      else if (iVar3 == 0) {
        if (result_p != (char **)0x0) {
          *result_p = "End of file";
        }
        if (errno_p != (int *)0x0) {
          *errno_p = 0;
        }
        iVar3 = fcntl(__fd,4,(ulong)(uVar8 & 0xfffff7ff));
        if (iVar3 == -1) {
          perror("fcntl nonblock");
        }
        return iVar9 - uVar2;
      }
      bVar7 = true;
      uVar10 = uVar2 - iVar3;
      bVar1 = iVar3 <= (int)uVar2;
      uVar2 = uVar10;
    } while (uVar10 != 0 && bVar1);
  }
  iVar3 = fcntl(__fd,4,(ulong)(uVar8 & 0xfffff7ff));
  if (iVar3 == -1) {
    perror("fcntl nonblock");
  }
  return iVar9;
}

Assistant:

int
unix_timeout_read_func(void *conn, void *buffer, size_t length, int *errno_p, char **result_p)
{
    int left = length;
    int count = 2;
    int iget;
    int fd = (int) (long) conn;
    int fdflags = fcntl(fd, F_GETFL, 0);

    fdflags |= O_NONBLOCK;
    if (fcntl(fd, F_SETFL, fdflags) == -1) 
	perror("fcntl block");
    iget = read(fd, (char *) buffer, length);
    if (iget == 0) {
	if (result_p) *result_p = "End of file";
	if (errno_p) *errno_p = 0;
	fdflags &= ~O_NONBLOCK;
	if (fcntl(fd, F_SETFL, fdflags) == -1) 
	    perror("fcntl nonblock");
	return 0;		/* end of file */
    } else if (iget == -1) {
	int lerrno = errno;
	if (errno_p) *errno_p = lerrno;
	if ((lerrno != EWOULDBLOCK) &&
	    (lerrno != EAGAIN) &&
	    (lerrno != EINTR)) {
	    /* serious error */
	    fdflags &= ~O_NONBLOCK;
	    if (fcntl(fd, F_SETFL, fdflags) == -1) 
		perror("fcntl nonblock");
	    return -1;
	} else {
	    if (errno_p) *errno_p = 0;
	    iget = 0;
	}
    }
    left = length - iget;
    while (left > 0) {
	count--;
	if (count <= 0) {
	    fdflags &= ~O_NONBLOCK;
	    if (fcntl(fd, F_SETFL, fdflags) == -1) 
		perror("fcntl nonblock");
	    return -1;
	}
	sleep(1);
	iget = read(fd, (char *) buffer + length - left, left);
	if (iget == 0) {
	    if (result_p) *result_p = "End of file";
	    if (errno_p) *errno_p = 0;
	    fdflags &= ~O_NONBLOCK;
	    if (fcntl(fd, F_SETFL, fdflags) == -1) 
		perror("fcntl nonblock");
	    return length - left;	/* end of file */
	} else if (iget == -1) {
	    int lerrno = errno;
	    if (errno_p) *errno_p = errno;
	    if ((lerrno != EWOULDBLOCK) &&
		(lerrno != EAGAIN) &&
		(lerrno != EINTR)) {
		/* serious error */
		fdflags &= ~O_NONBLOCK;
		if (fcntl(fd, F_SETFL, fdflags) == -1) 
		    perror("fcntl nonblock");
		return (length - left);
	    } else {
		if (errno_p) *errno_p = 0;
		iget = 0;
	    }
	}
	left -= iget;
    }
    fdflags &= ~O_NONBLOCK;
    if (fcntl(fd, F_SETFL, fdflags) == -1) 
	perror("fcntl nonblock");
    return length;
}